

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  bool *pbVar1;
  long lVar2;
  Interval local_40;
  
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
    tcu::FloatFormat::convert(&local_40,fmt,(Interval *)(&value->m_data[0].m_hasNaN + lVar2));
    *(double *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_40.m_hi;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_40._0_8_;
    *(double *)(pbVar1 + 8) = local_40.m_lo;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}